

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::CopyString
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char **a_pString)

{
  size_t sVar1;
  Entry local_48;
  char *local_30;
  char *pCopy;
  size_t uLen;
  char **a_pString_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  pCopy = (char *)0x0;
  uLen = (size_t)a_pString;
  a_pString_local = &this->m_pData;
  sVar1 = strlen(*a_pString);
  pCopy = (char *)(sVar1 + 1);
  local_30 = (char *)operator_new__((ulong)pCopy);
  if (local_30 == (char *)0x0) {
    this_local._4_4_ = SI_NOMEM;
  }
  else {
    memcpy(local_30,*(void **)uLen,(size_t)pCopy);
    Entry::Entry(&local_48,local_30,0);
    std::__cxx11::
    list<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
    ::push_back(&this->m_strings,&local_48);
    *(char **)uLen = local_30;
    this_local._4_4_ = SI_OK;
  }
  return this_local._4_4_;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::CopyString(const SI_CHAR *&a_pString) {
	size_t uLen = 0;
	if (sizeof(SI_CHAR) == sizeof(char)) {
		uLen = strlen((const char *)a_pString);
	} else if (sizeof(SI_CHAR) == sizeof(wchar_t)) {
		uLen = wcslen((const wchar_t *)a_pString);
	} else {
		for (; a_pString[uLen]; ++uLen) /*loop*/
			;
	}
	++uLen;  // NULL character
	SI_CHAR *pCopy = new SI_CHAR[uLen];
	if (!pCopy) {
		return SI_NOMEM;
	}
	memcpy(pCopy, a_pString, sizeof(SI_CHAR) * uLen);
	m_strings.push_back(pCopy);
	a_pString = pCopy;
	return SI_OK;
}